

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

void __thiscall icu_63::Edits::addReplace(Edits *this,int32_t oldLength,int32_t newLength)

{
  ushort uVar1;
  UBool UVar2;
  int iVar3;
  uint r;
  uint uVar4;
  int iVar5;
  int local_2c;
  ushort local_28;
  int32_t limit;
  int32_t head;
  int32_t last;
  int32_t u;
  int32_t newDelta;
  int32_t newLength_local;
  int32_t oldLength_local;
  Edits *this_local;
  
  UVar2 = ::U_FAILURE(this->errorCode_);
  if (UVar2 == '\0') {
    if ((oldLength < 0) || (newLength < 0)) {
      this->errorCode_ = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if ((oldLength != 0) || (newLength != 0)) {
      this->numChanges = this->numChanges + 1;
      iVar3 = newLength - oldLength;
      if (iVar3 != 0) {
        if ((((0 < iVar3) && (-1 < this->delta)) && (0x7fffffff - this->delta < iVar3)) ||
           (((iVar3 < 0 && (this->delta < 0)) && (iVar3 < -0x80000000 - this->delta)))) {
          this->errorCode_ = U_INDEX_OUTOFBOUNDS_ERROR;
          return;
        }
        this->delta = iVar3 + this->delta;
      }
      if (((oldLength < 1) || (6 < oldLength)) || (7 < newLength)) {
        if ((oldLength < 0x3d) && (newLength < 0x3d)) {
          append(this,newLength | oldLength << 6 | 0x7000U);
        }
        else if ((4 < this->capacity - this->length) || (UVar2 = growArray(this), UVar2 != '\0')) {
          iVar3 = this->length;
          iVar5 = iVar3 + 1;
          if (oldLength < 0x3d) {
            local_28 = (ushort)(oldLength << 6) | 0x7000;
            local_2c = iVar5;
          }
          else if (oldLength < 0x8000) {
            local_28 = 0x7f40;
            local_2c = iVar3 + 2;
            this->array[iVar5] = (ushort)oldLength | 0x8000;
          }
          else {
            local_28 = ((short)(oldLength >> 0x1e) + 0x3e) * 0x40 | 0x7000;
            this->array[iVar5] = (ushort)(oldLength >> 0xf) | 0x8000;
            local_2c = iVar3 + 3;
            this->array[iVar3 + 2] = (ushort)oldLength | 0x8000;
          }
          uVar1 = (ushort)newLength;
          if (0x3c < newLength) {
            if (newLength < 0x8000) {
              this->array[local_2c] = uVar1 | 0x8000;
              local_2c = local_2c + 1;
              uVar1 = 0x3d;
            }
            else {
              iVar3 = local_2c + 1;
              this->array[local_2c] = (ushort)(newLength >> 0xf) | 0x8000;
              local_2c = local_2c + 2;
              this->array[iVar3] = uVar1 | 0x8000;
              uVar1 = (short)(newLength >> 0x1e) + 0x3e;
            }
          }
          local_28 = uVar1 | local_28;
          this->array[this->length] = local_28;
          this->length = local_2c;
        }
      }
      else {
        r = oldLength << 0xc | newLength << 9;
        uVar4 = lastUnit(this);
        if (((((int)uVar4 < 0x1000) || (0x6ffe < (int)uVar4)) || ((uVar4 & 0xfffffe00) != r)) ||
           (0x1fe < (uVar4 & 0x1ff))) {
          append(this,r);
        }
        else {
          setLastUnit(this,uVar4 + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void Edits::addReplace(int32_t oldLength, int32_t newLength) {
    if(U_FAILURE(errorCode_)) { return; }
    if(oldLength < 0 || newLength < 0) {
        errorCode_ = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    if (oldLength == 0 && newLength == 0) {
        return;
    }
    ++numChanges;
    int32_t newDelta = newLength - oldLength;
    if (newDelta != 0) {
        if ((newDelta > 0 && delta >= 0 && newDelta > (INT32_MAX - delta)) ||
                (newDelta < 0 && delta < 0 && newDelta < (INT32_MIN - delta))) {
            // Integer overflow or underflow.
            errorCode_ = U_INDEX_OUTOFBOUNDS_ERROR;
            return;
        }
        delta += newDelta;
    }

    if(0 < oldLength && oldLength <= MAX_SHORT_CHANGE_OLD_LENGTH &&
            newLength <= MAX_SHORT_CHANGE_NEW_LENGTH) {
        // Merge into previous same-lengths short-replacement record, if any.
        int32_t u = (oldLength << 12) | (newLength << 9);
        int32_t last = lastUnit();
        if(MAX_UNCHANGED < last && last < MAX_SHORT_CHANGE &&
                (last & ~SHORT_CHANGE_NUM_MASK) == u &&
                (last & SHORT_CHANGE_NUM_MASK) < SHORT_CHANGE_NUM_MASK) {
            setLastUnit(last + 1);
            return;
        }
        append(u);
        return;
    }

    int32_t head = 0x7000;
    if (oldLength < LENGTH_IN_1TRAIL && newLength < LENGTH_IN_1TRAIL) {
        head |= oldLength << 6;
        head |= newLength;
        append(head);
    } else if ((capacity - length) >= 5 || growArray()) {
        int32_t limit = length + 1;
        if(oldLength < LENGTH_IN_1TRAIL) {
            head |= oldLength << 6;
        } else if(oldLength <= 0x7fff) {
            head |= LENGTH_IN_1TRAIL << 6;
            array[limit++] = (uint16_t)(0x8000 | oldLength);
        } else {
            head |= (LENGTH_IN_2TRAIL + (oldLength >> 30)) << 6;
            array[limit++] = (uint16_t)(0x8000 | (oldLength >> 15));
            array[limit++] = (uint16_t)(0x8000 | oldLength);
        }
        if(newLength < LENGTH_IN_1TRAIL) {
            head |= newLength;
        } else if(newLength <= 0x7fff) {
            head |= LENGTH_IN_1TRAIL;
            array[limit++] = (uint16_t)(0x8000 | newLength);
        } else {
            head |= LENGTH_IN_2TRAIL + (newLength >> 30);
            array[limit++] = (uint16_t)(0x8000 | (newLength >> 15));
            array[limit++] = (uint16_t)(0x8000 | newLength);
        }
        array[length] = (uint16_t)head;
        length = limit;
    }
}